

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.h
# Opt level: O3

void gen_ss_advance(DisasContext_conflict1 *s)

{
  TCGContext_conflict1 *s_00;
  TCGTemp *ts;
  
  if (s->ss_active == true) {
    s_00 = s->uc->tcg_ctx;
    s->pstate_ss = false;
    ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i32,(TCGArg)ts,(TCGArg)(s_00->cpu_env + (long)s_00),0x148);
    tcg_gen_andi_i32_aarch64
              (s_00,(TCGv_i32)((long)ts - (long)s_00),(TCGv_i32)((long)ts - (long)s_00),-0x200001);
    tcg_gen_op3_aarch64(s_00,INDEX_op_st_i32,(TCGArg)ts,(TCGArg)(s_00->cpu_env + (long)s_00),0x148);
    tcg_temp_free_internal_aarch64(s_00,ts);
    return;
  }
  return;
}

Assistant:

static inline void gen_ss_advance(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (s->ss_active) {
        s->pstate_ss = 0;
        clear_pstate_bits(tcg_ctx, PSTATE_SS);
    }
}